

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O2

Builder * embree::sse2::BVH4InstanceMeshBuilderSAH
                    (void *bvh,Instance *mesh,GTypeMask gtype,uint geomID,size_t mode)

{
  BVHNBuilderSAH<4,_embree::InstancePrimitive> *this;
  
  this = (BVHNBuilderSAH<4,_embree::InstancePrimitive> *)::operator_new(0xa8);
  BVHNBuilderSAH<4,_embree::InstancePrimitive>::BVHNBuilderSAH
            (this,(BVH *)bvh,&mesh->super_Geometry,geomID,4,1.0,1,0xffffffffffffffff,gtype);
  return &this->super_Builder;
}

Assistant:

Builder* BVH4InstanceMeshBuilderSAH (void* bvh, Instance* mesh, Geometry::GTypeMask gtype, unsigned int geomID, size_t mode) {
      return new BVHNBuilderSAH<4,InstancePrimitive>((BVH4*)bvh,mesh,geomID,4,1.0f,1,inf,gtype);
    }